

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void BM_Comb_filter(State *state)

{
  bool bVar1;
  span<float,_128L> local_a28;
  span<const_float,_512L> local_a20;
  value_type local_a14;
  undefined1 local_a10 [8];
  array<float,_128UL> output;
  array<float,_512UL> input;
  State *state_local;
  
  local_a14 = 1.0;
  re::std::array<float,_512UL>::fill((array<float,_512UL> *)(output._M_elems + 0x7e),&local_a14);
  while( true ) {
    bVar1 = benchmark::State::KeepRunning(state);
    if (!bVar1) break;
    gsl::span<float_const,512l>::span<512ul,float>
              ((span<float_const,512l> *)&local_a20,(array<float,_512UL> *)(output._M_elems + 0x7e))
    ;
    gsl::span<float,128l>::span<128ul,float>
              ((span<float,128l> *)&local_a28,(array<float,_128UL> *)local_a10);
    re::math::comb_filter<float,512l,128l>(local_a20,local_a28);
  }
  return;
}

Assistant:

static void BM_Comb_filter(benchmark::State& state) {
    std::array<float, 512> input;
    std::array<float, 128> output;
    input.fill(1);
    while (state.KeepRunning()) {
        re::math::comb_filter(
            gsl::span<float const, 512>{input},
            gsl::span<float, 128>{output}
        );
    }
}